

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_ast_t * mpc_ast_traverse_next(mpc_ast_trav_t **trav)

{
  mpc_ast_t *pmVar1;
  mpc_ast_trav_t *pmVar2;
  int iVar3;
  long lVar4;
  mpc_ast_trav_t *pmVar5;
  mpc_ast_t *pmVar6;
  
  pmVar5 = *trav;
  if (pmVar5 != (mpc_ast_trav_t *)0x0) {
    if (pmVar5->order == mpc_ast_trav_order_post) {
      pmVar1 = pmVar5->curr_node;
      *trav = pmVar5->parent;
      free(pmVar5);
      pmVar5 = *trav;
      if (pmVar5 == (mpc_ast_trav_t *)0x0) {
        return pmVar1;
      }
      lVar4 = (long)pmVar5->curr_child + 1;
      pmVar5->curr_child = (int)lVar4;
      pmVar6 = pmVar5->curr_node;
      iVar3 = pmVar6->children_num;
      if (iVar3 <= (int)lVar4) {
        return pmVar1;
      }
      while (0 < iVar3) {
        pmVar2 = (mpc_ast_trav_t *)malloc(0x18);
        pmVar6 = pmVar6->children[lVar4];
        pmVar2->curr_node = pmVar6;
        pmVar2->parent = pmVar5;
        pmVar2->curr_child = 0;
        pmVar2->order = pmVar5->order;
        *trav = pmVar2;
        lVar4 = 0;
        pmVar5 = pmVar2;
        iVar3 = pmVar6->children_num;
      }
      return pmVar1;
    }
    if (pmVar5->order == mpc_ast_trav_order_pre) {
      pmVar1 = pmVar5->curr_node;
      while( true ) {
        if (pmVar5 == (mpc_ast_trav_t *)0x0) {
          return pmVar1;
        }
        iVar3 = pmVar5->curr_child;
        pmVar6 = pmVar5->curr_node;
        if (iVar3 < pmVar6->children_num) break;
        *trav = pmVar5->parent;
        free(pmVar5);
        pmVar5 = *trav;
      }
      pmVar2 = (mpc_ast_trav_t *)malloc(0x18);
      pmVar2->curr_node = pmVar6->children[iVar3];
      pmVar2->parent = pmVar5;
      pmVar2->curr_child = 0;
      pmVar2->order = pmVar5->order;
      pmVar5->curr_child = iVar3 + 1;
      *trav = pmVar2;
      return pmVar1;
    }
  }
  return (mpc_ast_t *)0x0;
}

Assistant:

mpc_ast_t *mpc_ast_traverse_next(mpc_ast_trav_t **trav) {
  mpc_ast_trav_t *n_trav, *to_free;
  mpc_ast_t *ret = NULL;
  int cchild;

  /* The end of traversal was reached */
  if(*trav == NULL) return NULL;

  switch((*trav)->order) {
    case mpc_ast_trav_order_pre:
      ret = (*trav)->curr_node;

      /* If there aren't any more children, go up */
      while(*trav != NULL &&
        (*trav)->curr_child >= (*trav)->curr_node->children_num)
      {
        to_free = *trav;
        *trav = (*trav)->parent;
        free(to_free);
      }

      /* If trav is NULL, the end was reached */
      if(*trav == NULL) {
        break;
      }

      /* Go to next child */
      n_trav = malloc(sizeof(mpc_ast_trav_t));

      cchild = (*trav)->curr_child;
      n_trav->curr_node = (*trav)->curr_node->children[cchild];
      n_trav->parent = *trav;
      n_trav->curr_child = 0;
      n_trav->order = (*trav)->order;

      (*trav)->curr_child++;
      *trav = n_trav;

      break;

    case mpc_ast_trav_order_post:
      ret = (*trav)->curr_node;

      /* Move up tree to the parent If the parent doesn't have any more nodes,
       * then this is the current node. If it does, move down to its left most
       * child. Also, free the previous traversal node */
      to_free = *trav;
      *trav = (*trav)->parent;
      free(to_free);

      if(*trav == NULL)
        break;

      /* Next child */
      (*trav)->curr_child++;

      /* If there aren't any more children, this is the next node */
      if((*trav)->curr_child >= (*trav)->curr_node->children_num) {
        break;
      }

      /* If there are still more children, find the leftmost child from this
       * node */
      while((*trav)->curr_node->children_num > 0) {
        n_trav = malloc(sizeof(mpc_ast_trav_t));

        cchild = (*trav)->curr_child;
        n_trav->curr_node = (*trav)->curr_node->children[cchild];
        n_trav->parent = *trav;
        n_trav->curr_child = 0;
        n_trav->order = (*trav)->order;

        *trav = n_trav;
      }

    default:
      /* Unreachable, but compiler complaints */
      break;
  }

  return ret;
}